

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_rawget(lua_State *L,int idx)

{
  int iVar1;
  Table *t;
  TValue *val;
  
  t = gettable(L,idx);
  val = luaH_get(t,(TValue *)((L->top).offset + -0x10));
  (L->top).p = (StkId)((L->top).offset + -0x10);
  iVar1 = finishrawget(L,val);
  return iVar1;
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  Table *t;
  const TValue *val;
  lua_lock(L);
  api_checknelems(L, 1);
  t = gettable(L, idx);
  val = luaH_get(t, s2v(L->top.p - 1));
  L->top.p--;  /* remove key */
  return finishrawget(L, val);
}